

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
despot::Floor::ComputeShortestPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Floor *this,int start,int end)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dist;
  int local_60;
  Coord CStack_5c;
  int next;
  Coord local_54;
  Coord pos;
  int a;
  double cur_dist;
  undefined1 local_25;
  int move;
  int local_20;
  int cur;
  int end_local;
  int start_local;
  Floor *this_local;
  vector<int,_std::allocator<int>_> *moves;
  
  local_25 = 0;
  move = start;
  local_20 = end;
  cur = start;
  _end_local = this;
  this_local = (Floor *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  do {
    if (move == local_20) {
      return __return_storage_ptr__;
    }
    cur_dist._4_4_ = 0;
    dVar3 = Distance(this,move,local_20);
    iVar2 = NumCells(this);
    if ((dVar3 == (double)iVar2) && (!NAN(dVar3) && !NAN((double)iVar2))) {
      return __return_storage_ptr__;
    }
    for (pos.x = 0; pos.x < 4; pos.x = pos.x + 1) {
      CStack_5c = GetCell(this,move);
      local_54 = despot::operator+(&stack0xffffffffffffffa4,
                                   (Coord *)(Compass::DIRECTIONS + (long)pos.x * 8));
      local_60 = move;
      bVar1 = Inside(this,local_54);
      if (bVar1) {
        local_60 = GetIndex(this,&local_54);
      }
      dVar4 = Distance(this,local_60,local_20);
      if (dVar4 < dVar3) {
        cur_dist._4_4_ = pos.x;
        move = local_60;
        break;
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)((long)&cur_dist + 4));
  } while( true );
}

Assistant:

vector<int> Floor::ComputeShortestPath(int start, int end) const {
	int cur = start;
	vector<int> moves;
	while (cur != end) {
		int move = 0;
		double cur_dist = Distance(cur, end);

		if (cur_dist == NumCells()) {
			return moves;
		}

		for (int a = 0; a < 4; a++) {
			Coord pos = GetCell(cur) + Compass::DIRECTIONS[a];
			int next = cur;
			if (Inside(pos))
				next = GetIndex(pos);

			double dist = Distance(next, end);

			if (dist < cur_dist) {
				move = a;
				cur = next;
				break;
			}
		}
		moves.push_back(move);
	}
	return moves;
}